

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<double>::OpenGeneric(TPZFileEqnStorage<double> *this,char option,char *name)

{
  char *pcVar1;
  FILE *pFVar2;
  char *in_RDX;
  char in_SIL;
  long in_RDI;
  int zero;
  int64_t sizereturn;
  undefined4 local_24;
  size_t local_20;
  undefined7 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 8) = 0xb;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x80),in_RDX);
  if (in_SIL == 'r') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"rb");
    *(FILE **)(in_RDI + 0xa0) = pFVar2;
    local_20 = 0;
    local_20 = fread((void *)(in_RDI + 8),4,1,*(FILE **)(in_RDI + 0xa0));
    local_20 = fread((void *)(in_RDI + 0xb0),4,1,*(FILE **)(in_RDI + 0xa0));
    ReadBlockPositions((TPZFileEqnStorage<double> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  }
  else if (in_SIL == 'w') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"wb");
    *(FILE **)(in_RDI + 0xa0) = pFVar2;
    local_24 = 0;
    fwrite((void *)(in_RDI + 8),4,1,*(FILE **)(in_RDI + 0xa0));
    fwrite(&local_24,4,1,*(FILE **)(in_RDI + 0xa0));
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::OpenGeneric(char option, const char * name)
{
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=11;

	fFileName = name;
	
	if(option=='r'){
		fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
		/**
		 *Opens binary files and get initial information
		 *use this information for storage requirements
		 */
		int64_t sizereturn;
		sizereturn = 0;
		sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		ReadBlockPositions();
	}else if(option=='w'){
		fIOStream = fopen(fFileName.c_str(),"wb"); //open for writing
		/**
		 *Writes NumHeaders and NumBlocks information in
		 *the two initial positions on fIOStream
		 */
		int zero = 0;
		fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
		fwrite(&zero,sizeof(int),1,fIOStream);
	}
}